

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_sample_locations
          (Impl *this,Value *state,VkPipelineSampleLocationsStateCreateInfoEXT **out_info)

{
  bool bVar1;
  uint uVar2;
  VkStructureType VVar3;
  VkSampleCountFlagBits VVar4;
  SizeType SVar5;
  VkPipelineSampleLocationsStateCreateInfoEXT *pVVar6;
  Type pGVar7;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *pGVar8;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *pGVar9;
  VkSampleLocationEXT *pVVar10;
  Type pGVar11;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *elem;
  float fVar12;
  
  pVVar6 = ScratchAllocator::allocate_cleared<VkPipelineSampleLocationsStateCreateInfoEXT>
                     (&this->allocator);
  *out_info = pVVar6;
  pGVar7 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"sampleLocationsEnable");
  uVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar7);
  pVVar6->sampleLocationsEnable = uVar2;
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(state,"sampleLocationsInfo");
  if (bVar1) {
    pGVar8 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)rapidjson::
                GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ::operator[]<char_const>
                          ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            *)state,"sampleLocationsInfo");
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(pGVar8,"sType");
    VVar3 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar7);
    (pVVar6->sampleLocationsInfo).sType = VVar3;
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(pGVar8,"sampleLocationsPerPixel");
    VVar4 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar7);
    (pVVar6->sampleLocationsInfo).sampleLocationsPerPixel = VVar4;
    pGVar9 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)rapidjson::
                GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ::operator[]<char_const>(pGVar8,"sampleLocationGridSize");
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(pGVar9,"width");
    uVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar7);
    (pVVar6->sampleLocationsInfo).sampleLocationGridSize.width = uVar2;
    pGVar9 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)rapidjson::
                GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ::operator[]<char_const>(pGVar8,"sampleLocationGridSize");
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(pGVar9,"height");
    uVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar7);
    (pVVar6->sampleLocationsInfo).sampleLocationGridSize.height = uVar2;
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)pGVar8,"sampleLocations");
    if (bVar1) {
      pGVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(pGVar8,"sampleLocations");
      SVar5 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::Size(pGVar7);
      pVVar10 = ScratchAllocator::allocate_n<VkSampleLocationEXT>(&this->allocator,(ulong)SVar5);
      SVar5 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::Size(pGVar7);
      (pVVar6->sampleLocationsInfo).sampleLocationsCount = SVar5;
      (pVVar6->sampleLocationsInfo).pSampleLocations = pVVar10;
      pGVar8 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                *)rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::Begin(pGVar7);
      while( true ) {
        pGVar9 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  *)rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::End(pGVar7);
        if (pGVar8 == pGVar9) break;
        pGVar11 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>(pGVar8,"x");
        fVar12 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetFloat(pGVar11);
        pVVar10->x = fVar12;
        pGVar11 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>(pGVar8,"y");
        fVar12 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetFloat(pGVar11);
        pVVar10->y = fVar12;
        pVVar10 = pVVar10 + 1;
        pGVar8 = pGVar8 + 0x10;
      }
    }
  }
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_sample_locations(const Value &state,
                                                 VkPipelineSampleLocationsStateCreateInfoEXT **out_info)
{
	auto *info = allocator.allocate_cleared<VkPipelineSampleLocationsStateCreateInfoEXT>();
	*out_info = info;

	info->sampleLocationsEnable = state["sampleLocationsEnable"].GetUint();
	if (state.HasMember("sampleLocationsInfo"))
	{
		auto &loc_info = state["sampleLocationsInfo"];
		info->sampleLocationsInfo.sType = static_cast<VkStructureType>(loc_info["sType"].GetUint());
		info->sampleLocationsInfo.sampleLocationsPerPixel = static_cast<VkSampleCountFlagBits>(loc_info["sampleLocationsPerPixel"].GetUint());
		info->sampleLocationsInfo.sampleLocationGridSize.width = loc_info["sampleLocationGridSize"]["width"].GetUint();
		info->sampleLocationsInfo.sampleLocationGridSize.height = loc_info["sampleLocationGridSize"]["height"].GetUint();

		if (loc_info.HasMember("sampleLocations"))
		{
			auto &locs = loc_info["sampleLocations"];

			auto *locations = allocator.allocate_n<VkSampleLocationEXT>(locs.Size());
			info->sampleLocationsInfo.sampleLocationsCount = uint32_t(locs.Size());
			info->sampleLocationsInfo.pSampleLocations = locations;

			for (auto itr = locs.Begin(); itr != locs.End(); ++itr)
			{
				auto &elem = *itr;
				locations->x = elem["x"].GetFloat();
				locations->y = elem["y"].GetFloat();
				locations++;
			}
		}
	}

	return true;
}